

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O2

void __thiscall cmXMLWriter::Attribute<char[13]>(cmXMLWriter *this,char *name,char (*value) [13])

{
  ostream *poVar1;
  cmXMLSafe local_30;
  
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,name);
  poVar1 = std::operator<<(poVar1,"=\"");
  cmXMLSafe::cmXMLSafe(&local_30,*value);
  poVar1 = operator<<(poVar1,&local_30);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }